

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  undefined4 *puVar2;
  element_type *peVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  foo *pfVar7;
  counted *pcVar8;
  exception *e;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  ostringstream oss_30;
  ostringstream oss_29;
  ostringstream oss_28;
  shared_ptr<counted> cnt3;
  weak_ptr<counted> wpcnt;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  ostringstream oss_24;
  ostringstream oss_23;
  shared_ptr<counted> cnt2;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  shared_ptr<counted> cnt;
  ostringstream oss_18;
  shared_ptr<bee> bee2;
  shared_ptr<bee> bee1;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  shared_ptr<bar> b;
  shared_ptr<foo> f;
  bad_weak_ptr *e_1;
  shared_ptr<int> p4_1;
  ostringstream oss_14;
  shared_ptr<int> p4;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  shared_ptr<int> p3;
  ostringstream oss_3;
  weak_ptr<int> wp;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  shared_ptr<int> p2;
  shared_ptr<int> p;
  shared_ptr<bar> *in_stack_ffffffffffffc198;
  __shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_stack_ffffffffffffc1a0;
  counted *in_stack_ffffffffffffc1a8;
  __shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffc1b0;
  shared_ptr<foo> *in_stack_ffffffffffffc1b8;
  string local_3898 [32];
  ostringstream local_3878 [376];
  __shared_ptr local_3700 [23];
  undefined1 local_36e9;
  string local_36e8 [32];
  ostringstream local_36c8 [383];
  undefined1 local_3549;
  string local_3548 [32];
  ostringstream local_3528 [383];
  undefined1 local_33a9;
  string local_33a8 [32];
  ostringstream local_3388 [383];
  undefined1 local_3209;
  string local_3208 [32];
  ostringstream local_31e8 [383];
  undefined1 local_3069;
  string local_3068 [32];
  ostringstream local_3048 [376];
  __shared_ptr local_2ed0 [39];
  undefined1 local_2ea9;
  string local_2ea8 [32];
  ostringstream local_2e88 [383];
  undefined1 local_2d09;
  string local_2d08 [32];
  ostringstream local_2ce8 [383];
  undefined1 local_2b69;
  string local_2b68 [32];
  ostringstream local_2b48 [383];
  undefined1 local_29c9;
  string local_29c8 [32];
  ostringstream local_29a8 [383];
  undefined1 local_2829;
  string local_2828 [32];
  ostringstream local_2808 [399];
  undefined1 local_2679;
  string local_2678 [32];
  ostringstream local_2658 [383];
  undefined1 local_24d9;
  string local_24d8 [32];
  ostringstream local_24b8 [383];
  undefined1 local_2339;
  string local_2338 [32];
  ostringstream local_2318 [383];
  undefined1 local_2199;
  string local_2198 [32];
  ostringstream local_2178 [399];
  undefined1 local_1fe9;
  string local_1fe8 [32];
  ostringstream local_1fc8 [415];
  undefined1 local_1e29;
  string local_1e28 [32];
  ostringstream local_1e08 [415];
  undefined1 local_1c69;
  string local_1c68 [32];
  ostringstream local_1c48 [399];
  undefined1 local_1ab9;
  string local_1ab8 [32];
  ostringstream local_1a98 [432];
  runtime_error local_18e8 [39];
  undefined1 local_18c1;
  string local_18c0 [32];
  ostringstream local_18a0 [376];
  __shared_ptr local_1728 [23];
  undefined1 local_1711;
  string local_1710 [32];
  ostringstream local_16f0 [383];
  undefined1 local_1571;
  string local_1570 [32];
  ostringstream local_1550 [383];
  undefined1 local_13d1;
  string local_13d0 [32];
  ostringstream local_13b0 [383];
  undefined1 local_1231;
  string local_1230 [32];
  ostringstream local_1210 [383];
  undefined1 local_1091;
  string local_1090 [32];
  ostringstream local_1070 [383];
  undefined1 local_ef1;
  string local_ef0 [32];
  ostringstream local_ed0 [383];
  undefined1 local_d51;
  string local_d50 [32];
  ostringstream local_d30 [383];
  undefined1 local_bb1;
  string local_bb0 [32];
  ostringstream local_b90 [383];
  undefined1 local_a11;
  string local_a10 [32];
  ostringstream local_9f0 [383];
  undefined1 local_871;
  string local_870 [32];
  ostringstream local_850 [376];
  __shared_ptr local_6d8 [23];
  undefined1 local_6c1;
  string local_6c0 [32];
  ostringstream local_6a0 [399];
  undefined1 local_511;
  string local_510 [32];
  ostringstream local_4f0 [383];
  undefined1 local_371;
  string local_370 [32];
  ostringstream local_350 [383];
  undefined1 local_1d1;
  string local_1d0 [32];
  ostringstream local_1b0 [408];
  __shared_ptr local_18 [20];
  undefined4 local_4;
  
  local_4 = 0;
  puVar2 = (undefined4 *)operator_new(4);
  *puVar2 = 10;
  std::shared_ptr<int>::shared_ptr<int,void>
            ((shared_ptr<int> *)in_stack_ffffffffffffc1a0,(int *)in_stack_ffffffffffffc198);
  std::shared_ptr<int>::shared_ptr
            ((shared_ptr<int> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<int> *)in_stack_ffffffffffffc198);
  peVar3 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (in_stack_ffffffffffffc1a0);
  if (*peVar3 != 10) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar5 = std::operator<<((ostream *)local_1b0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x48);
    std::operator<<(poVar5," *p2==10");
    local_1d1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)0x107515);
  if (lVar4 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_350);
    poVar5 = std::operator<<((ostream *)local_350,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x49);
    std::operator<<(poVar5," p2.use_count() == 2");
    local_371 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_370);
    local_371 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (in_stack_ffffffffffffc1a0);
  *peVar3 = 0x14;
  peVar3 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (in_stack_ffffffffffffc1a0);
  if (*peVar3 != 0x14) {
    std::__cxx11::ostringstream::ostringstream(local_4f0);
    poVar5 = std::operator<<((ostream *)local_4f0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4b);
    std::operator<<(poVar5," *p==20");
    local_511 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_510);
    local_511 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::weak_ptr<int>::weak_ptr<int,void>
            ((weak_ptr<int> *)in_stack_ffffffffffffc1a0,(shared_ptr<int> *)in_stack_ffffffffffffc198
            );
  lVar4 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)0x107876);
  if (lVar4 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_6a0);
    poVar5 = std::operator<<((ostream *)local_6a0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4d);
    std::operator<<(poVar5," p.use_count() == 2");
    local_6c1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_6c0);
    local_6c1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::weak_ptr<int>::lock((weak_ptr<int> *)in_stack_ffffffffffffc1a8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_6d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_850);
    poVar5 = std::operator<<((ostream *)local_850,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4f);
    std::operator<<(poVar5," p3");
    local_871 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_870);
    local_871 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)0x107bf9);
  if (lVar4 != 3) {
    std::__cxx11::ostringstream::ostringstream(local_9f0);
    poVar5 = std::operator<<((ostream *)local_9f0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
    std::operator<<(poVar5," p3.use_count() == 3");
    local_a11 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_a10);
    local_a11 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (in_stack_ffffffffffffc1a0);
  if (*peVar3 != 0x14) {
    std::__cxx11::ostringstream::ostringstream(local_b90);
    poVar5 = std::operator<<((ostream *)local_b90,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x51);
    std::operator<<(poVar5," *p2==20");
    local_bb1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_bb0);
    local_bb1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::expired
                    ((__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)0x107f36);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_d30);
    poVar5 = std::operator<<((ostream *)local_d30,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x52);
    std::operator<<(poVar5," !wp.expired()");
    local_d51 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_d50);
    local_d51 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_ed0);
    poVar5 = std::operator<<((ostream *)local_ed0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x53);
    std::operator<<(poVar5," p");
    local_ef1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_ef0);
    local_ef1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1070);
    poVar5 = std::operator<<((ostream *)local_1070,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x54);
    std::operator<<(poVar5," !!p");
    local_1091 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1090);
    local_1091 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffc1b0);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffc1b0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1210);
    poVar5 = std::operator<<((ostream *)local_1210,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
    std::operator<<(poVar5," !p");
    local_1231 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1230);
    local_1231 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)0x1085c6);
  if (lVar4 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_13b0);
    poVar5 = std::operator<<((ostream *)local_13b0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x58);
    std::operator<<(poVar5," p3.use_count() == 1");
    local_13d1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_13d0);
    local_13d1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffc1b0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_6d8);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1550);
    poVar5 = std::operator<<((ostream *)local_1550,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5a);
    std::operator<<(poVar5," !p3");
    local_1571 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1570);
    local_1571 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::expired
                    ((__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)0x10890d);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_16f0);
    poVar5 = std::operator<<((ostream *)local_16f0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5b);
    std::operator<<(poVar5," wp.expired()");
    local_1711 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1710);
    local_1711 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::weak_ptr<int>::lock((weak_ptr<int> *)in_stack_ffffffffffffc1a8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_1728);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_18a0);
    poVar5 = std::operator<<((ostream *)local_18a0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d);
    std::operator<<(poVar5," !p4");
    local_18c1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_18c0);
    local_18c1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<int>::shared_ptr<int,void>
            ((shared_ptr<int> *)in_stack_ffffffffffffc1a0,(weak_ptr<int> *)in_stack_ffffffffffffc198
            );
  std::runtime_error::runtime_error(local_18e8,"Should not get there");
  std::runtime_error::~runtime_error(local_18e8);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x108cad);
  pfVar7 = (foo *)operator_new(8);
  foo::foo(pfVar7);
  std::shared_ptr<foo>::shared_ptr<foo,void>
            ((shared_ptr<foo> *)in_stack_ffffffffffffc1a0,(foo *)in_stack_ffffffffffffc198);
  operator_new(8);
  bar::bar((bar *)in_stack_ffffffffffffc1a0);
  std::shared_ptr<bar>::shared_ptr<bar,void>
            ((shared_ptr<bar> *)in_stack_ffffffffffffc1a0,(bar *)in_stack_ffffffffffffc198);
  std::shared_ptr<foo>::operator=
            ((shared_ptr<foo> *)in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198);
  std::dynamic_pointer_cast<bar,foo>(in_stack_ffffffffffffc1b8);
  bVar1 = std::operator==((shared_ptr<bar> *)in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198);
  std::shared_ptr<bar>::~shared_ptr((shared_ptr<bar> *)0x108ddb);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a98);
    poVar5 = std::operator<<((ostream *)local_1a98,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
    std::operator<<(poVar5," booster::dynamic_pointer_cast<bar>(f)==b");
    local_1ab9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1ab8);
    local_1ab9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::static_pointer_cast<bar,foo>((shared_ptr<foo> *)in_stack_ffffffffffffc1a8);
  bVar1 = std::operator==((shared_ptr<bar> *)in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198);
  std::shared_ptr<bar>::~shared_ptr((shared_ptr<bar> *)0x108fe4);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c48);
    poVar5 = std::operator<<((ostream *)local_1c48,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x69);
    std::operator<<(poVar5," booster::static_pointer_cast<bar>(f)==b");
    local_1c69 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1c68);
    local_1c69 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pfVar7 = (foo *)operator_new(8);
  foo::foo(pfVar7);
  std::__shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2>::reset<foo>
            ((__shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffc1b0,
             (foo *)in_stack_ffffffffffffc1a8);
  std::dynamic_pointer_cast<bar,foo>(in_stack_ffffffffffffc1b8);
  std::shared_ptr<bar>::shared_ptr((shared_ptr<bar> *)0x1091d7);
  bVar1 = std::operator==((shared_ptr<bar> *)in_stack_ffffffffffffc1a0,in_stack_ffffffffffffc198);
  std::shared_ptr<bar>::~shared_ptr((shared_ptr<bar> *)0x109200);
  std::shared_ptr<bar>::~shared_ptr((shared_ptr<bar> *)0x10920d);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e08);
    poVar5 = std::operator<<((ostream *)local_1e08,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6b);
    std::operator<<(poVar5," booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>()");
    local_1e29 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1e28);
    local_1e29 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  operator_new(0x10);
  bee::bee((bee *)0x1093c5);
  std::shared_ptr<bee>::shared_ptr<bee,void>
            ((shared_ptr<bee> *)in_stack_ffffffffffffc1a0,(bee *)in_stack_ffffffffffffc198);
  std::__shared_ptr_access<bee,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<bee,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1093eb);
  bee::self((bee *)in_stack_ffffffffffffc198);
  bVar1 = std::operator==((shared_ptr<bee> *)in_stack_ffffffffffffc1a0,
                          (shared_ptr<bee> *)in_stack_ffffffffffffc198);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1fc8);
    poVar5 = std::operator<<((ostream *)local_1fc8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6f);
    std::operator<<(poVar5," bee1==bee2");
    local_1fe9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1fe8);
    local_1fe9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<counted>::shared_ptr((shared_ptr<counted> *)0x109609);
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream(local_2178);
    poVar5 = std::operator<<((ostream *)local_2178,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x72);
    std::operator<<(poVar5," counted::counter==0");
    local_2199 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2198);
    local_2199 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar8 = (counted *)operator_new(1);
  counted::counted(pcVar8);
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>
            (in_stack_ffffffffffffc1b0,in_stack_ffffffffffffc1a8);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2318);
    poVar5 = std::operator<<((ostream *)local_2318,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x74);
    std::operator<<(poVar5," counted::counter==1");
    local_2339 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2338);
    local_2339 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffc1b0);
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream(local_24b8);
    poVar5 = std::operator<<((ostream *)local_24b8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x76);
    std::operator<<(poVar5," counted::counter==0");
    local_24d9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_24d8);
    local_24d9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar8 = (counted *)operator_new(1);
  counted::counted(pcVar8);
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>
            (in_stack_ffffffffffffc1b0,in_stack_ffffffffffffc1a8);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2658);
    poVar5 = std::operator<<((ostream *)local_2658,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x78);
    std::operator<<(poVar5," counted::counter==1");
    local_2679 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2678);
    local_2679 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<counted>::shared_ptr
            ((shared_ptr<counted> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<counted> *)in_stack_ffffffffffffc198);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2808);
    poVar5 = std::operator<<((ostream *)local_2808,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7a);
    std::operator<<(poVar5," counted::counter==1");
    local_2829 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2828);
    local_2829 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar8 = (counted *)operator_new(1);
  counted::counted(pcVar8);
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>
            (in_stack_ffffffffffffc1b0,in_stack_ffffffffffffc1a8);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream(local_29a8);
    poVar5 = std::operator<<((ostream *)local_29a8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7c);
    std::operator<<(poVar5," counted::counter==2");
    local_29c9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_29c8);
    local_29c9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<counted>::operator=
            ((shared_ptr<counted> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<counted> *)in_stack_ffffffffffffc198);
  std::shared_ptr<counted>::operator=
            ((shared_ptr<counted> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<counted> *)in_stack_ffffffffffffc198);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream(local_2b48);
    poVar5 = std::operator<<((ostream *)local_2b48,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7f);
    std::operator<<(poVar5," counted::counter==2");
    local_2b69 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2b68);
    local_2b69 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<counted>::operator=
            ((shared_ptr<counted> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<counted> *)in_stack_ffffffffffffc198);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2ce8);
    poVar5 = std::operator<<((ostream *)local_2ce8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x81);
    std::operator<<(poVar5," counted::counter==1");
    local_2d09 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2d08);
    local_2d09 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<counted>::operator=
            ((shared_ptr<counted> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<counted> *)in_stack_ffffffffffffc198);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_2e88);
    poVar5 = std::operator<<((ostream *)local_2e88,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
    std::operator<<(poVar5," counted::counter==1");
    local_2ea9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2ea8);
    local_2ea9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::weak_ptr<counted>::weak_ptr<counted,void>
            ((weak_ptr<counted> *)in_stack_ffffffffffffc1a0,
             (shared_ptr<counted> *)in_stack_ffffffffffffc198);
  std::weak_ptr<counted>::lock((weak_ptr<counted> *)in_stack_ffffffffffffc1a8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2ed0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3048);
    poVar5 = std::operator<<((ostream *)local_3048,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x86);
    std::operator<<(poVar5," cnt3");
    local_3069 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3068);
    local_3069 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_31e8);
    poVar5 = std::operator<<((ostream *)local_31e8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x87);
    std::operator<<(poVar5," counted::counter==1");
    local_3209 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3208);
    local_3209 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffc1b0);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream(local_3388);
    poVar5 = std::operator<<((ostream *)local_3388,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x89);
    std::operator<<(poVar5," counted::counter==1");
    local_33a9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_33a8);
    local_33a9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffc1b0);
  if (counted::counter == 1) {
    std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffc1b0);
    if (counted::counter != 0) {
      std::__cxx11::ostringstream::ostringstream(local_36c8);
      poVar5 = std::operator<<((ostream *)local_36c8,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
      std::operator<<(poVar5," counted::counter==0");
      local_36e9 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_36e8);
      local_36e9 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::weak_ptr<counted>::lock((weak_ptr<counted> *)in_stack_ffffffffffffc1a8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_3700);
    std::shared_ptr<counted>::~shared_ptr((shared_ptr<counted> *)0x10ae48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_3878);
      poVar5 = std::operator<<((ostream *)local_3878,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8e);
      std::operator<<(poVar5," !wpcnt.lock()");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_3898);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::shared_ptr<counted>::~shared_ptr((shared_ptr<counted> *)0x10afc5);
    std::weak_ptr<counted>::~weak_ptr((weak_ptr<counted> *)0x10afd2);
    std::shared_ptr<counted>::~shared_ptr((shared_ptr<counted> *)0x10afdf);
    std::shared_ptr<counted>::~shared_ptr((shared_ptr<counted> *)0x10afec);
    std::shared_ptr<bee>::~shared_ptr((shared_ptr<bee> *)0x10aff9);
    std::shared_ptr<bee>::~shared_ptr((shared_ptr<bee> *)0x10b006);
    std::shared_ptr<bar>::~shared_ptr((shared_ptr<bar> *)0x10b013);
    std::shared_ptr<foo>::~shared_ptr((shared_ptr<foo> *)0x10b020);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x10b02d);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x10b03a);
    std::weak_ptr<int>::~weak_ptr((weak_ptr<int> *)0x10b047);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x10b054);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x10b061);
    poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_3528);
  poVar5 = std::operator<<((ostream *)local_3528,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8b);
  std::operator<<(poVar5," counted::counter==1");
  local_3549 = 1;
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar6,local_3548);
  local_3549 = 0;
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		booster::shared_ptr<int> p(new int(10));
		booster::shared_ptr<int> p2=p;
		TEST(*p2==10);
		TEST(p2.use_count() == 2);
		*p2=20;
		TEST(*p==20);
		booster::weak_ptr<int> wp=p;
		TEST(p.use_count() == 2);
		booster::shared_ptr<int> p3=wp.lock();
		TEST(p3);
		TEST(p3.use_count() == 3);
		TEST(*p2==20);
		TEST(!wp.expired());
		TEST(p);
		TEST(!!p);
		p.reset();
		p2.reset();
		TEST(!p);
		TEST(p3.use_count() == 1);
		p3.reset();
		TEST(!p3);
		TEST(wp.expired());
		booster::shared_ptr<int> p4=wp.lock();
		TEST(!p4);

		try {
			booster::shared_ptr<int> p4(wp);
			std::runtime_error("Should not get there");
		}
		catch(booster::bad_weak_ptr const &e){}

		booster::shared_ptr<foo> f(new foo);
		booster::shared_ptr<bar> b(new bar);
		f=b;
		TEST(booster::dynamic_pointer_cast<bar>(f)==b);
		TEST(booster::static_pointer_cast<bar>(f)==b);
		f.reset(new foo);
		TEST(booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>());

		booster::shared_ptr<bee> bee1(new bee);
		booster::shared_ptr<bee> bee2=bee1->self();
		TEST(bee1==bee2);

		booster::shared_ptr<counted> cnt;
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		booster::shared_ptr<counted> cnt2(cnt);
		TEST(counted::counter==1);
		cnt.reset(new counted);
		TEST(counted::counter==2);
		cnt=cnt;
		cnt2=cnt2;
		TEST(counted::counter==2);
		cnt=cnt2;
		TEST(counted::counter==1);
		cnt2=cnt;
		TEST(counted::counter==1);
		booster::weak_ptr<counted> wpcnt(cnt2);
		booster::shared_ptr<counted> cnt3=wpcnt.lock();
		TEST(cnt3);
		TEST(counted::counter==1);
		cnt3.reset();
		TEST(counted::counter==1);
		cnt2.reset();
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		TEST(!wpcnt.lock());

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;	
}